

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_leb.c
# Opt level: O0

int dwarf_encode_signed_leb128(Dwarf_Signed value,int *nbytes,char *space,int splen)

{
  bool bVar1;
  byte local_51;
  uchar byte;
  char *end;
  int more;
  Dwarf_Signed sign;
  char *str;
  int splen_local;
  char *space_local;
  int *nbytes_local;
  Dwarf_Signed value_local;
  
  bVar1 = true;
  sign = (Dwarf_Signed)space;
  nbytes_local = (int *)value;
  do {
    local_51 = (byte)nbytes_local & 0x7f;
    nbytes_local = (int *)((long)nbytes_local >> 7);
    if (space + splen <= (ulong)sign) {
      return 1;
    }
    if ((nbytes_local == (int *)(long)(int)-(uint)(value < 0)) &&
       ((long)(int)(local_51 & 0x40) == ((ulong)(long)(int)-(uint)(value < 0) & 0x40))) {
      bVar1 = false;
    }
    else {
      local_51 = local_51 | 0x80;
    }
    *(byte *)sign = local_51;
    sign = sign + 1;
  } while (bVar1);
  *nbytes = (int)sign - (int)space;
  return 0;
}

Assistant:

int dwarf_encode_signed_leb128(Dwarf_Signed value, int *nbytes,
    char *space, int splen)
{
    char *str;
    Dwarf_Signed sign = -(value < 0);
    int more = 1;
    char *end = space + splen;

    str = space;

    do {
        unsigned char byte = value & DATA_MASK;

        value >>= DIGIT_WIDTH;

        if (str >= end) {
            return DW_DLV_ERROR;
        }
        /*  Remaining chunks would just contain the sign
            bit, and this chunk
            has already captured at least one sign bit.  */
        if (value == sign &&
            ((byte & SIGN_BIT) == (sign & SIGN_BIT))) {
            more = 0;
        } else {
            byte |= MORE_BYTES;
        }
        *str = byte;
        str++;
    } while (more);
    *nbytes = (int)(str - space);
    return DW_DLV_OK;
}